

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateDSTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::DynamicState::anon_unknown_0::DepthStencilBaseCase::iterate
          (TestStatus *__return_storage_ptr__,DepthStencilBaseCase *this)

{
  allocator<char> local_39;
  string local_38;
  DepthStencilBaseCase *local_18;
  DepthStencilBaseCase *this_local;
  
  local_18 = this;
  this_local = (DepthStencilBaseCase *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Implement iterate() method!",&local_39);
  tcu::TestStatus::fail(__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

virtual tcu::TestStatus iterate (void)
	{
		DE_ASSERT(false);
		return tcu::TestStatus::fail("Implement iterate() method!");
	}